

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O3

vector<Record,_std::allocator<Record>_> * __thiscall
Block::getRecord(vector<Record,_std::allocator<Record>_> *__return_storage_ptr__,Block *this,
                float key)

{
  size_type *psVar1;
  pointer pRVar2;
  pointer pcVar3;
  pointer pRVar4;
  undefined1 local_60 [8];
  Record record;
  
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar4 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar2) {
    psVar1 = &record.tconst._M_string_length;
    record.numVotes = (int)key;
    do {
      pcVar3 = (pRVar4->tconst)._M_dataplus._M_p;
      local_60 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar3,pcVar3 + (pRVar4->tconst)._M_string_length);
      record.tconst.field_2._8_4_ = pRVar4->averageRating;
      record.tconst.field_2._12_4_ = pRVar4->numVotes;
      if (((float)(int)record.tconst.field_2._12_4_ == (float)record.numVotes) &&
         (!NAN((float)(int)record.tconst.field_2._12_4_) && !NAN((float)record.numVotes))) {
        std::vector<Record,_std::allocator<Record>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_60);
      }
      if (local_60 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_60);
      }
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Record> Block::getRecord(float key) {
    std::vector<Record> recordFound;
    for (Record record : records) {
        if (record.numVotes == key) {
            recordFound.push_back(record);
            // return record;
        }
    }
    // return empty record, but should not happen
    return recordFound;
}